

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O0

FName __thiscall FSkillInfo::GetReplacedBy(FSkillInfo *this,FName *b)

{
  FName *pFVar1;
  FName *in_RDX;
  FName local_28;
  FName local_24 [3];
  FName *b_local;
  FSkillInfo *this_local;
  
  b_local = b;
  this_local = this;
  FName::FName(local_24,in_RDX);
  pFVar1 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::CheckKey
                     ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(b + 0x2e),
                      local_24);
  if (pFVar1 == (FName *)0x0) {
    FName::FName(&this->Name,NAME_None);
  }
  else {
    FName::FName(&local_28,in_RDX);
    pFVar1 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator[]
                       ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(b + 0x2e),
                        &local_28);
    FName::FName(&this->Name,pFVar1);
  }
  return (FName)(int)this;
}

Assistant:

FName FSkillInfo::GetReplacedBy(FName b)
{
	if (Replaced.CheckKey(b)) return Replaced[b];
	else return NAME_None;
}